

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::SkipList
          (SkipList<unsigned_long,_leveldb::Comparator> *this,Arena *param_2)

{
  Node *pNVar1;
  int local_2c;
  unsigned_long uStack_28;
  int i;
  Arena *local_20;
  Arena *arena_local;
  SkipList<unsigned_long,_leveldb::Comparator> *this_local;
  
  this->arena_ = param_2;
  uStack_28 = 0;
  local_20 = param_2;
  arena_local = (Arena *)this;
  pNVar1 = NewNode(this,&stack0xffffffffffffffd8,0xc);
  this->head_ = pNVar1;
  std::atomic<int>::atomic(&this->max_height_,1);
  Random::Random(&this->rnd_,0xdeadbeef);
  for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
    Node::SetNext(this->head_,local_2c,(Node *)0x0);
  }
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}